

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  char *pcVar27;
  int64_t *piVar28;
  ulong extraout_RDX;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  char *__format;
  int iVar33;
  int32_t j;
  int64_t *piVar34;
  ulong uVar35;
  int64_t *piVar36;
  int32_t i;
  int iVar37;
  ulong uVar38;
  bool bVar39;
  long lVar40;
  ulong extraout_XMM0_Qa;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  long lVar53;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long lVar61;
  undefined1 auVar64 [16];
  longlong lVar62;
  long lVar63;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  long lVar69;
  __m128i_64_t B;
  undefined1 auVar70 [16];
  __m128i_64_t B_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i_64_t B_3;
  undefined1 auVar73 [16];
  __m128i_64_t B_4;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i alVar82;
  int32_t s2Len_00;
  undefined1 local_398 [16];
  undefined8 uStack_390;
  undefined1 local_378 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  long local_2e8;
  long lStack_2e0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined4 local_278;
  undefined4 uStack_274;
  long local_248;
  long lStack_240;
  __m128i vNWS;
  long local_228;
  long lStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  ulong uStack_1d0;
  long local_1c8;
  int64_t *piStack_1c0;
  long local_1b8;
  long lStack_1b0;
  undefined1 local_1a8 [16];
  undefined8 uStack_160;
  ulong uStack_150;
  ulong uStack_130;
  long lStack_f0;
  ulong uStack_e0;
  long lStack_c0;
  int64_t *array;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "_s2";
LAB_0067f294:
    fprintf(_stderr,__format,"parasail_nw_stats_table_diag_sse41_128_64",pcVar27);
    return (parasail_result_t *)0x0;
  }
  uVar31 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar27 = "s2Len";
    goto LAB_0067f294;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar27 = "open";
    goto LAB_0067f294;
  }
  piVar36 = (int64_t *)(ulong)(uint)gap;
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar27 = "gap";
    goto LAB_0067f294;
  }
  uVar35 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar27 = "matrix";
    goto LAB_0067f294;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_table_diag_sse41_128_64");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar27 = "_s1";
      goto LAB_0067f294;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar27 = "_s1Len";
      goto LAB_0067f294;
    }
    if (matrix->type == 0) goto LAB_0067e1d2;
  }
  uVar35 = (ulong)(uint)matrix->length;
LAB_0067e1d2:
  iVar16 = matrix->min;
  iVar32 = -open;
  uVar30 = 0x8000000000000000 - (long)iVar16;
  if (iVar16 != iVar32 && SBORROW4(iVar16,iVar32) == iVar16 + open < 0) {
    uVar30 = (ulong)(uint)open | 0x8000000000000000;
  }
  iVar16 = matrix->max;
  iVar33 = (int)uVar35;
  ppVar17 = parasail_result_new_table3(iVar33,s2Len);
  if (ppVar17 != (parasail_result_t *)0x0) {
    ppVar17->flag = ppVar17->flag | 0x2831001;
    ptr = parasail_memalign_int64_t(0x10,(long)(iVar33 + 1));
    uVar18 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar18);
    auVar41._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
    auVar41._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
    auVar64._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
    auVar64._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
    auVar41 = packssdw(auVar41,auVar64);
    auVar70._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
    auVar70._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
    auVar74._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
    auVar74._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
    auVar64 = packssdw(auVar70,auVar74);
    auVar41 = packssdw(auVar41,auVar64);
    uVar18 = 0;
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf]))
    {
      uVar21 = iVar33 - 1;
      iVar22 = s2Len + -1;
      uVar29 = uVar30 + 1;
      local_1f8._0_8_ = 0x7ffffffffffffffe - (long)iVar16;
      auVar42._8_4_ = (int)uVar29;
      auVar42._0_8_ = uVar29;
      auVar42._12_4_ = (int)(uVar29 >> 0x20);
      auVar80._8_4_ = (int)local_1f8._0_8_;
      auVar80._0_8_ = local_1f8._0_8_;
      auVar80._12_4_ = (int)((ulong)local_1f8._0_8_ >> 0x20);
      uVar23 = (ulong)iVar33;
      lVar1 = uVar23 - 1;
      auVar43._8_4_ = (int)lVar1;
      auVar43._0_8_ = lVar1;
      auVar43._12_4_ = (int)((ulong)lVar1 >> 0x20);
      lVar2 = uVar31 - 1;
      auVar44._8_4_ = (int)lVar2;
      auVar44._0_8_ = lVar2;
      auVar44._12_4_ = (int)((ulong)lVar2 >> 0x20);
      piVar28 = (int64_t *)(long)iVar32;
      local_1c8 = (long)(iVar32 - gap);
      uVar24 = 0;
      if (0 < iVar33) {
        uVar24 = uVar35;
      }
      for (; uVar19 = uVar23, uVar24 != uVar18; uVar18 = uVar18 + 1) {
        ptr[uVar18] = (long)matrix->mapper[(byte)_s1[uVar18]];
      }
      for (; (long)uVar19 <= (long)uVar23; uVar19 = uVar19 + 1) {
        ptr[uVar19] = 0;
      }
      piVar4 = matrix->mapper;
      for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
        ptr_00[uVar18 + 1] = (long)piVar4[(byte)_s2[uVar18]];
      }
      *ptr_00 = 0;
      for (uVar18 = uVar31; (int)uVar18 <= s2Len; uVar18 = uVar18 + 1) {
        ptr_00[uVar18 + 1] = 0;
      }
      vWH_02[0] = piVar28;
      for (lVar25 = 0; uVar31 * 8 - lVar25 != 0; lVar25 = lVar25 + 8) {
        *(int64_t **)((long)ptr_01 + lVar25 + 8) = vWH_02[0];
        *(undefined8 *)((long)ptr_02 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_03 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_04 + lVar25 + 8) = 0;
        *(ulong *)((long)ptr_05 + lVar25 + 8) = uVar29;
        *(undefined8 *)((long)ptr_06 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_07 + lVar25 + 8) = 0;
        *(undefined8 *)((long)ptr_08 + lVar25 + 8) = 0;
        vWH_02[0] = (int64_t *)((long)vWH_02[0] - (long)piVar36);
      }
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = 0;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      vWH_02[0] = ptr_05 + uVar31 + 1;
      array = ptr_04 + uVar31 + 1;
      for (lVar25 = 0; s2Len + (int)lVar25 <= s2Len; lVar25 = lVar25 + 1) {
        ptr_01[uVar31 + lVar25 + 1] = 0;
        ptr_02[uVar31 + lVar25 + 1] = 0;
        ptr_03[uVar31 + lVar25 + 1] = 0;
        array[lVar25] = 0;
        vWH_02[0][lVar25] = 0;
        ptr_06[uVar31 + lVar25 + 1] = 0;
        ptr_07[uVar31 + lVar25 + 1] = 0;
        ptr_08[uVar31 + lVar25 + 1] = 0;
      }
      *ptr_01 = 0;
      local_208._0_12_ = ZEXT812(1);
      local_208._12_4_ = 0;
      uStack_160 = auVar80._8_8_;
      local_1f8._8_8_ = uStack_160;
      uVar18 = 0;
      auVar41 = auVar42;
      auVar64 = auVar42;
      auVar70 = auVar42;
      auVar74 = auVar42;
      local_1e8 = auVar42;
      piStack_1c0 = piVar28;
      while ((long)uVar18 < (long)uVar23) {
        uVar24 = ptr[uVar18];
        uVar19 = ptr[uVar18 + 1];
        piVar4 = matrix->matrix;
        iVar16 = matrix->size;
        uVar15 = (uint)uVar18 | 1;
        if ((long)uVar23 <= (long)(uVar18 | 1)) {
          uVar15 = uVar21;
        }
        bVar39 = matrix->type != 0;
        uVar26 = uVar24;
        if (bVar39) {
          uVar26 = uVar18;
        }
        uVar20 = (long)(int)uVar15;
        if (!bVar39) {
          uVar20 = uVar19;
        }
        piVar3 = piVar4 + uVar20 * (long)iVar16;
        lStack_2e0 = *ptr_01;
        local_2e8 = 0;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = (long)piVar28 - uVar18 * (long)piVar36;
        auVar58 = auVar58 << 0x40;
        lVar25 = (long)piVar28 - (uVar18 + 2) * (long)piVar36;
        *ptr_01 = lVar25;
        local_248 = 0;
        lStack_240 = 0;
        lStack_f0 = auVar43._8_8_;
        vNWS[0] = 0;
        vNWS[1] = 0;
        local_228 = 0;
        lStack_220 = 0;
        auVar81 = (undefined1  [16])0x0;
        auVar79 = (undefined1  [16])0x0;
        auVar80 = (undefined1  [16])0x0;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar29;
        local_338 = auVar56 << 0x40;
        local_288._0_4_ = 0;
        local_288._4_4_ = 0;
        local_288._8_4_ = 0;
        local_288._12_4_ = 0;
        local_298._0_4_ = 0;
        local_298._4_4_ = 0;
        local_298._8_4_ = 0;
        local_298._12_4_ = 0;
        local_378._0_4_ = 0;
        local_378._4_4_ = 0;
        local_378._8_4_ = 0;
        local_378._12_4_ = 0;
        local_348 = (undefined1  [16])0x0;
        local_1b8 = -1;
        lStack_1b0 = 0;
        uStack_1d0 = auVar42._8_8_;
        uStack_130 = uStack_1d0;
        uVar20 = uVar18;
        vWH_02[0] = piVar36;
        array = piVar28;
        uVar76 = uVar29;
        local_2a8._0_8_ = 0;
        local_218._0_8_ = 0;
        for (uVar38 = 0; uVar38 <= uVar31; uVar38 = uVar38 + 1) {
          lVar40 = auVar58._8_8_;
          lVar5 = ptr_01[uVar38 + 1];
          lVar61 = auVar81._8_8_;
          iVar6 = ptr_02[uVar38 + 1];
          lVar62 = auVar79._8_8_;
          iVar7 = ptr_03[uVar38 + 1];
          lVar63 = auVar80._8_8_;
          iVar8 = ptr_04[uVar38 + 1];
          lVar69 = ptr_05[uVar38 + 1];
          local_2a8._8_8_ = ptr_06[uVar38 + 1];
          local_218._8_8_ = ptr_07[uVar38 + 1];
          local_348._0_8_ = local_348._8_8_;
          local_348._8_8_ = ptr_08[uVar38 + 1];
          lVar53 = lVar5 - (ulong)(uint)open;
          uStack_150 = (ulong)(uint)gap;
          local_1a8._8_8_ = lVar69 - uStack_150;
          local_1a8._0_8_ = uVar76 - (long)piVar36;
          alVar82[1] = (longlong)vWH_02[0];
          alVar82[0] = (longlong)array;
          b[1] = lVar25;
          b[0] = uVar20;
          piVar34 = ptr_05;
          alVar82 = _mm_cmpgt_epi64_rpl(alVar82,b);
          j = (int32_t)piVar34;
          b_00[0] = alVar82[1];
          auVar54._8_8_ = iVar6;
          auVar54._0_8_ = lVar61;
          auVar54 = pblendvb(local_2a8,auVar54,extraout_XMM0);
          auVar55._8_8_ = iVar7;
          auVar55._0_8_ = lVar62;
          auVar55 = pblendvb(local_218,auVar55,extraout_XMM0);
          auVar73._8_8_ = iVar8;
          auVar73._0_8_ = lVar63;
          auVar56 = pblendvb(local_348,auVar73,extraout_XMM0);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          local_348._0_8_ = auVar56._0_8_ + 1;
          local_348._8_8_ = auVar56._8_8_ - auVar57._8_8_;
          local_398._0_8_ = auVar58._0_8_;
          local_398._0_8_ = local_398._0_8_ - (ulong)(uint)open;
          uStack_390 = lVar40 - (ulong)(uint)open;
          local_338._0_8_ = local_338._0_8_ - (long)piVar36;
          local_338._8_8_ = local_338._8_8_ - uStack_150;
          a[1] = (longlong)vWH_02[0];
          a[0] = (longlong)array;
          b_00[1] = lVar25;
          _mm_cmpgt_epi64_rpl(a,b_00);
          auVar56 = pblendvb(local_288,auVar81,extraout_XMM0_00);
          auVar73 = pblendvb(local_298,auVar79,extraout_XMM0_00);
          auVar80 = pblendvb(local_378,auVar80,extraout_XMM0_00);
          uVar9 = ptr_00[uVar38 + 1];
          b_01[1] = (long)piVar4[uVar26 * (long)iVar16 + uVar9];
          auVar71._0_8_ = local_2e8 + piVar3[ptr_00[uVar38]];
          auVar71._8_8_ = lStack_2e0 + b_01[1];
          auVar81._8_8_ = lVar53;
          auVar81._0_8_ = lVar40 - (ulong)(uint)open;
          auVar79._0_8_ =
               -(ulong)((long)(uVar76 - (long)piVar36) < (long)(lVar40 - (ulong)(uint)open));
          auVar79._8_8_ = -(ulong)((long)(lVar69 - uStack_150) < lVar53);
          auVar75 = blendvpd(local_1a8,auVar81,auVar79);
          auVar77._0_8_ = -(ulong)((long)local_338._0_8_ < local_398._0_8_);
          auVar77._8_8_ = -(ulong)((long)local_338._8_8_ < (long)(lVar40 - (ulong)(uint)open));
          auVar57 = blendvpd(local_338,local_398,auVar77);
          auVar45._0_8_ = -(ulong)(auVar57._0_8_ < auVar71._0_8_);
          auVar45._8_8_ = -(ulong)(auVar57._8_8_ < auVar71._8_8_);
          auVar58 = blendvpd(auVar57,auVar71,auVar45);
          auVar46._0_8_ = -(ulong)(auVar75._0_8_ < auVar58._0_8_);
          uVar76 = auVar75._8_8_;
          auVar46._8_8_ = -(ulong)((long)uVar76 < auVar58._8_8_);
          auVar77 = blendvpd(auVar75,auVar58,auVar46);
          auVar58 = blendvpd(auVar54,auVar56,auVar46);
          auVar72._0_8_ = -(ulong)(auVar71._0_8_ == auVar77._0_8_);
          auVar72._8_8_ = -(ulong)(auVar71._8_8_ == auVar77._8_8_);
          auVar59._0_8_ = local_248 + (ulong)(uVar19 == uStack_130);
          auVar59._8_8_ = lStack_240 + (ulong)(uVar24 == uVar9);
          auVar81 = blendvpd(auVar58,auVar59,auVar72);
          auVar58 = blendvpd(auVar55,auVar73,auVar46);
          local_378._0_8_ = auVar80._0_8_;
          local_378._8_8_ = auVar80._8_8_;
          local_378._8_8_ = local_378._8_8_ + 1;
          local_378._0_8_ = local_378._0_8_ + 1;
          a_00[1] = (longlong)vWH_02[0];
          a_00[0] = (longlong)array;
          b_01[0] = (longlong)piVar3;
          _mm_cmpgt_epi64_rpl(a_00,b_01);
          auVar60._0_8_ = (extraout_XMM0_Qa & 1) + vNWS[0];
          auVar60._8_8_ = (extraout_XMM0_Qb & 1) + vNWS[1];
          auVar79 = blendvpd(auVar58,auVar60,auVar72);
          auVar80 = blendvpd(local_348,local_378,auVar46);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar65._0_8_ = local_228 + 1;
          auVar65._8_8_ = lStack_220 - auVar68._8_8_;
          auVar80 = blendvpd(auVar80,auVar65,auVar72);
          auVar78._0_8_ = -(ulong)(local_1b8 == -1);
          auVar78._8_8_ = -(ulong)(lStack_1b0 == auVar68._8_8_);
          auVar66._8_8_ = piStack_1c0;
          auVar66._0_8_ = local_1c8;
          auVar58 = blendvpd(auVar77,auVar66,auVar78);
          auVar81 = ~auVar78 & auVar81;
          auVar79 = ~auVar78 & auVar79;
          auVar80 = ~auVar78 & auVar80;
          local_338 = blendvpd(auVar57,auVar42,auVar78);
          lVar25 = auVar80._0_8_;
          lVar69 = auVar58._0_8_;
          if (1 < uVar38) {
            auVar47._0_8_ = -(ulong)(local_1f8._0_8_ < lVar69);
            auVar47._8_8_ = -(ulong)(local_1f8._8_8_ < auVar58._8_8_);
            local_1f8 = blendvpd(auVar58,local_1f8,auVar47);
            auVar48._0_8_ = -(ulong)(lVar69 < local_1e8._0_8_);
            auVar48._8_8_ = -(ulong)(auVar58._8_8_ < local_1e8._8_8_);
            auVar66 = blendvpd(auVar58,local_1e8,auVar48);
            auVar49._0_8_ = -(ulong)(auVar81._0_8_ < auVar66._0_8_);
            auVar49._8_8_ = -(ulong)(auVar81._8_8_ < auVar66._8_8_);
            auVar66 = blendvpd(auVar81,auVar66,auVar49);
            auVar50._0_8_ = -(ulong)(auVar79._0_8_ < auVar66._0_8_);
            auVar50._8_8_ = -(ulong)(auVar79._8_8_ < auVar66._8_8_);
            auVar66 = blendvpd(auVar79,auVar66,auVar50);
            auVar51._0_8_ = -(ulong)(lVar25 < auVar66._0_8_);
            auVar51._8_8_ = -(ulong)(auVar80._8_8_ < auVar66._8_8_);
            local_1e8 = blendvpd(auVar80,auVar66,auVar51);
          }
          auVar56 = ~auVar78 & auVar56;
          auVar73 = ~auVar78 & auVar73;
          local_378 = ~auVar78 & local_378;
          vWH[0] = uVar18 & 0xffffffff;
          i = (int32_t)uVar38;
          s2Len_00 = auVar58._0_4_;
          vWH[1] = uVar35;
          arr_store_si128(*((ppVar17->field_4).trace)->trace_del_table,vWH,i,s2Len,j,s2Len_00);
          vWH_00[0] = uVar18 & 0xffffffff;
          vWH_00[1] = uVar35;
          arr_store_si128(*(int **)((long)((ppVar17->field_4).trace)->trace_del_table + 8),vWH_00,i,
                          s2Len,j,s2Len_00);
          vWH_01[0] = uVar18 & 0xffffffff;
          vWH_01[1] = uVar35;
          arr_store_si128(*(int **)((long)((ppVar17->field_4).trace)->trace_del_table + 0x10),vWH_01
                          ,i,s2Len,j,s2Len_00);
          array = *(int64_t **)((long)((ppVar17->field_4).trace)->trace_del_table + 0x18);
          vWH_02[0] = (int64_t *)(uVar18 & 0xffffffff);
          vWH_02[1] = uVar35;
          arr_store_si128((int *)array,vWH_02,i,s2Len,j,s2Len_00);
          lStack_c0 = auVar44._8_8_;
          auVar52._0_8_ = -(ulong)(local_1b8 == lVar2);
          auVar52._8_8_ = -(ulong)(lStack_1b0 == lStack_c0);
          auVar14._8_8_ = -(ulong)(local_208._8_8_ == lStack_f0);
          auVar14._0_8_ = -(ulong)(local_208._0_8_ == lVar1);
          auVar52 = auVar52 & auVar14;
          auVar74 = blendvpd(auVar74,auVar58,auVar52);
          auVar41 = blendvpd(auVar41,auVar81,auVar52);
          auVar64 = blendvpd(auVar64,auVar79,auVar52);
          auVar70 = blendvpd(auVar70,auVar80,auVar52);
          ptr_01[uVar38] = lVar69;
          ptr_02[uVar38] = auVar81._0_8_;
          ptr_03[uVar38] = auVar79._0_8_;
          ptr_04[uVar38] = lVar25;
          ptr_05[uVar38] = auVar75._0_8_;
          local_2a8._0_8_ = auVar54._0_8_;
          local_2a8._8_8_ = auVar54._8_8_;
          ptr_06[uVar38] = local_2a8._0_8_;
          local_218._0_8_ = auVar55._0_8_;
          local_218._8_8_ = auVar55._8_8_;
          ptr_07[uVar38] = local_218._0_8_;
          ptr_08[uVar38] = local_348._0_8_;
          local_1b8 = local_1b8 + 1;
          lStack_1b0 = lStack_1b0 + 1;
          vNWS[1] = iVar7;
          vNWS[0] = lVar62;
          local_288._0_4_ = auVar56._0_4_;
          local_288._4_4_ = auVar56._4_4_;
          local_288._8_4_ = auVar56._8_4_;
          local_288._12_4_ = auVar56._12_4_;
          local_298._0_4_ = auVar73._0_4_;
          local_298._4_4_ = auVar73._4_4_;
          local_298._8_4_ = auVar73._8_4_;
          local_298._12_4_ = auVar73._12_4_;
          uVar20 = extraout_RDX;
          local_2a8._0_8_ = local_2a8._8_8_;
          local_218._0_8_ = local_218._8_8_;
          uStack_130 = uVar9;
          local_248 = lVar61;
          lStack_240 = iVar6;
          local_228 = lVar63;
          lStack_220 = iVar8;
          local_2e8 = lVar40;
          lStack_2e0 = lVar5;
        }
        local_208._8_8_ = local_208._8_8_ + 2;
        local_208._0_8_ = local_208._0_8_ + 2;
        uStack_e0 = (ulong)(uint)(gap * 2);
        local_1c8 = local_1c8 - (ulong)(uint)(gap * 2);
        piStack_1c0 = (int64_t *)((long)piStack_1c0 - uStack_e0);
        uVar18 = uVar18 + 2;
      }
      iVar16 = 2;
      uVar31 = uVar29;
      uVar35 = uVar29;
      uVar18 = uVar29;
      while( true ) {
        iVar37 = (int)uVar18;
        iVar33 = (int)uVar35;
        iVar32 = (int)uVar31;
        bVar39 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar39) break;
        uVar23 = auVar74._8_8_;
        if ((long)uVar29 < (long)uVar23) {
          uVar29 = uVar23;
          uVar31 = auVar41._8_8_;
          uVar35 = auVar64._8_8_;
          uVar18 = auVar70._8_8_;
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auVar74._0_8_;
        auVar74 = auVar10 << 0x40;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar41._0_8_;
        auVar41 = auVar11 << 0x40;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar64._0_8_;
        auVar64 = auVar12 << 0x40;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar70._0_8_;
        auVar70 = auVar13 << 0x40;
      }
      local_278 = (undefined4)uVar30;
      uStack_274 = (undefined4)(uVar30 >> 0x20);
      uStack_390._0_4_ = local_278;
      local_398._0_8_ = uVar30;
      uStack_390._4_4_ = uStack_274;
      a_01[1] = (longlong)vWH_02[0];
      a_01[0] = (longlong)array;
      b_02[1] = uVar23;
      b_02[0] = uVar29;
      _mm_cmpgt_epi64_rpl(a_01,b_02);
      iVar16 = (int)uVar29;
      auVar67._0_8_ = -(ulong)((long)uVar30 < (long)local_1f8._0_8_);
      auVar67._8_8_ = -(ulong)(uStack_390 < (long)local_1f8._8_8_);
      auVar75._8_4_ = 0xffffffff;
      auVar75._0_8_ = 0xffffffffffffffff;
      auVar75._12_4_ = 0xffffffff;
      auVar41 = auVar75 ^ auVar67 | extraout_XMM0_01;
      if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0'
         ) {
        *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
        uVar21 = 0;
        iVar22 = 0;
        iVar16 = 0;
        iVar32 = 0;
        iVar33 = 0;
        iVar37 = 0;
      }
      ppVar17->score = iVar16;
      ppVar17->end_query = uVar21;
      ppVar17->end_ref = iVar22;
      ((ppVar17->field_4).stats)->matches = iVar32;
      ((ppVar17->field_4).stats)->similar = iVar33;
      ((ppVar17->field_4).stats)->length = iVar37;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar17;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}